

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_26::RustCodeGenerator::GenerateMakeRule
          (RustCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  _Base_ptr p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  string make_rule;
  string filebase;
  RustGenerator generator;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  RustGenerator local_420;
  
  StripExtension((string *)&local_420,filename);
  StripPath(&local_460,(string *)&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  rust::RustGenerator::RustGenerator(&local_420,parser,path,filename);
  BaseGenerator::GeneratedFileName
            ((string *)&local_4b0,&local_420.super_BaseGenerator,path,&local_460,&parser->opts);
  std::operator+(&local_480,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b0,
                 ": ");
  std::__cxx11::string::~string((string *)&local_4b0);
  Parser::GetIncludedFilesRecursive
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_4b0,parser,filename);
  for (p_Var1 = local_4b0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &local_4b0._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::operator+(&local_440," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    std::__cxx11::string::append((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_440);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_4b0);
  rust::RustGenerator::~RustGenerator(&local_420);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::operator=((string *)output,(string *)&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = RustMakeRule(parser, path, filename);
    return Status::OK;
  }